

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlign_Ceil_Test::ArenaAlign_Ceil_Test
          (ArenaAlign_Ceil_Test *this)

{
  ArenaAlign_Ceil_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ArenaAlign_Ceil_Test_0299e8a0;
  return;
}

Assistant:

TEST(ArenaAlign, Ceil) {
  auto align_64 = ArenaAlignAs(64);
  EXPECT_THAT(align_64.Ceil(0), Eq(0));
  EXPECT_THAT(align_64.Ceil(1), Eq(64));
  EXPECT_THAT(align_64.Ceil(63), Eq(64));
  EXPECT_THAT(align_64.Ceil(64), Eq(64));
  EXPECT_THAT(align_64.Ceil(65), Eq(128));
  EXPECT_THAT(align_64.Ceil(127), Eq(128));
  EXPECT_THAT(align_64.Ceil(128), Eq(128));
}